

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aggregate_executor.hpp
# Opt level: O3

void duckdb::AggregateExecutor::
     IntersectFrames<duckdb::ModeFunction<duckdb::ModeString>::UpdateWindowState<duckdb::ModeState<duckdb::string_t,duckdb::ModeString>,duckdb::string_t>>
               (SubFrames *lefts,SubFrames *rights,
               UpdateWindowState<duckdb::ModeState<duckdb::string_t,_duckdb::ModeString>,_duckdb::string_t>
               *op)

{
  byte bVar1;
  const_reference pvVar2;
  ulong uVar3;
  const_reference pvVar4;
  idx_t iVar5;
  ulong uVar6;
  ulong begin;
  idx_t end;
  ulong __n;
  byte bVar7;
  FrameBounds last;
  value_type local_40;
  
  pvVar2 = vector<duckdb::FrameBounds,_true>::operator[](rights,0);
  uVar6 = pvVar2->start;
  pvVar2 = vector<duckdb::FrameBounds,_true>::operator[](lefts,0);
  begin = pvVar2->start;
  if (uVar6 < pvVar2->start) {
    begin = uVar6;
  }
  pvVar2 = vector<duckdb::FrameBounds,_true>::back(rights);
  uVar6 = pvVar2->end;
  pvVar2 = vector<duckdb::FrameBounds,_true>::back(lefts);
  uVar3 = pvVar2->end;
  if (pvVar2->end < uVar6) {
    uVar3 = uVar6;
  }
  local_40.start = uVar3;
  local_40.end = uVar3;
  if (begin < uVar3) {
    __n = 0;
    uVar6 = 0;
    do {
      if (uVar6 < (ulong)((long)(lefts->
                                super_vector<duckdb::FrameBounds,_std::allocator<duckdb::FrameBounds>_>
                                ).
                                super__Vector_base<duckdb::FrameBounds,_std::allocator<duckdb::FrameBounds>_>
                                ._M_impl.super__Vector_impl_data._M_finish -
                          (long)(lefts->
                                super_vector<duckdb::FrameBounds,_std::allocator<duckdb::FrameBounds>_>
                                ).
                                super__Vector_base<duckdb::FrameBounds,_std::allocator<duckdb::FrameBounds>_>
                                ._M_impl.super__Vector_impl_data._M_start >> 4)) {
        pvVar2 = vector<duckdb::FrameBounds,_true>::operator[](lefts,uVar6);
        bVar7 = begin < pvVar2->end && pvVar2->start <= begin;
      }
      else {
        bVar7 = false;
        pvVar2 = &local_40;
      }
      if (__n < (ulong)((long)(rights->
                              super_vector<duckdb::FrameBounds,_std::allocator<duckdb::FrameBounds>_>
                              ).
                              super__Vector_base<duckdb::FrameBounds,_std::allocator<duckdb::FrameBounds>_>
                              ._M_impl.super__Vector_impl_data._M_finish -
                        (long)(rights->
                              super_vector<duckdb::FrameBounds,_std::allocator<duckdb::FrameBounds>_>
                              ).
                              super__Vector_base<duckdb::FrameBounds,_std::allocator<duckdb::FrameBounds>_>
                              ._M_impl.super__Vector_impl_data._M_start >> 4)) {
        pvVar4 = vector<duckdb::FrameBounds,_true>::operator[](rights,__n);
        bVar1 = (begin < pvVar4->end) * '\x02';
        if (begin < pvVar4->start) {
          bVar1 = 0;
        }
        bVar7 = bVar1 | bVar7;
      }
      else {
        pvVar4 = &local_40;
      }
      if (bVar7 == 2) {
        end = pvVar2->start;
        if (pvVar4->end < pvVar2->start) {
          end = pvVar4->end;
        }
        ModeFunction<duckdb::ModeString>::
        UpdateWindowState<duckdb::ModeState<duckdb::string_t,_duckdb::ModeString>,_duckdb::string_t>
        ::Right(op,begin,end);
      }
      else if (bVar7 == 1) {
        end = pvVar4->start;
        if (pvVar2->end < pvVar4->start) {
          end = pvVar2->end;
        }
        ModeFunction<duckdb::ModeString>::
        UpdateWindowState<duckdb::ModeState<duckdb::string_t,_duckdb::ModeString>,_duckdb::string_t>
        ::Left(op,begin,end);
      }
      else {
        if (bVar7 == 0) {
          iVar5 = pvVar4->start;
          end = pvVar2->start;
        }
        else {
          iVar5 = pvVar4->end;
          end = pvVar2->end;
        }
        if (iVar5 < end) {
          end = iVar5;
        }
      }
      uVar6 = uVar6 + (end == pvVar2->end);
      __n = __n + (end == pvVar4->end);
      begin = end;
    } while (end < uVar3);
  }
  return;
}

Assistant:

static void IntersectFrames(const SubFrames &lefts, const SubFrames &rights, OP &op) {
		const auto cover_start = MinValue(rights[0].start, lefts[0].start);
		const auto cover_end = MaxValue(rights.back().end, lefts.back().end);
		const FrameBounds last(cover_end, cover_end);

		//	Subframe indices
		idx_t l = 0;
		idx_t r = 0;
		for (auto i = cover_start; i < cover_end;) {
			uint8_t overlap = 0;

			// Are we in the previous frame?
			auto left = &last;
			if (l < lefts.size()) {
				left = &lefts[l];
				overlap |= uint8_t(left->start <= i && i < left->end) << 0;
			}

			// Are we in the current frame?
			auto right = &last;
			if (r < rights.size()) {
				right = &rights[r];
				overlap |= uint8_t(right->start <= i && i < right->end) << 1;
			}

			auto limit = i;
			switch (overlap) {
			case 0x00:
				// i ∉ F U P
				limit = MinValue(right->start, left->start);
				op.Neither(i, limit);
				break;
			case 0x01:
				// i ∈ P \ F
				limit = MinValue(left->end, right->start);
				op.Left(i, limit);
				break;
			case 0x02:
				// i ∈ F \ P
				limit = MinValue(right->end, left->start);
				op.Right(i, limit);
				break;
			case 0x03:
			default:
				D_ASSERT(overlap == 0x03);
				// i ∈ F ∩ P
				limit = MinValue(right->end, left->end);
				op.Both(i, limit);
				break;
			}

			// Advance  the subframe indices
			i = limit;
			l += (i == left->end);
			r += (i == right->end);
		}
	}